

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::AbortAssertionExpr::fromSyntax(AcceptOnPropertyExprSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  Scope *pSVar2;
  ExpressionSyntax *syntax_00;
  Compilation *this;
  AssertionExpr *this_00;
  long lVar3;
  int iVar4;
  Expression *this_01;
  undefined4 extraout_var;
  AbortAssertionExpr *pAVar5;
  logic_error *this_02;
  long *plVar6;
  char *func;
  size_type *psVar7;
  AssertionInstanceDetails *pAVar8;
  ASTContext *pAVar9;
  bool isSync;
  Action action;
  bool local_f5;
  Action local_f4;
  undefined1 local_f0 [24];
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  AssertionInstanceDetails *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar2 = (context->scope).ptr;
  if (pSVar2 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    syntax_00 = (syntax->condition).ptr;
    if (syntax_00 == (ExpressionSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
    }
    else {
      this = pSVar2->compilation;
      this_01 = bindExpr(syntax_00,context,false);
      this_00 = (AssertionExpr *)(syntax->expr).ptr;
      if (this_00 != (AssertionExpr *)0x0) {
        iVar4 = AssertionExpr::bind(this_00,(int)context,(sockaddr *)0x0,0);
        TVar1 = (syntax->keyword).kind;
        if (TVar1 < SyncAcceptOnKeyword) {
          if (TVar1 == AcceptOnKeyword) {
            local_f4 = Accept;
          }
          else {
            if (TVar1 != RejectOnKeyword) {
LAB_00385a93:
              this_02 = (logic_error *)__cxa_allocate_exception(0x10);
              local_90[0] = local_80;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_90,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
                         ,"");
              plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
              local_d0._M_dataplus._M_p = (pointer)*plVar6;
              psVar7 = (size_type *)(plVar6 + 2);
              if ((size_type *)local_d0._M_dataplus._M_p == psVar7) {
                local_d0.field_2._M_allocated_capacity = *psVar7;
                local_d0.field_2._8_8_ = plVar6[3];
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              }
              else {
                local_d0.field_2._M_allocated_capacity = *psVar7;
              }
              local_d0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::to_string(&local_70,0x447);
              std::operator+(&local_50,&local_d0,&local_70);
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
              local_b0 = (AssertionInstanceDetails *)*plVar6;
              pAVar8 = (AssertionInstanceDetails *)(plVar6 + 2);
              if (local_b0 == pAVar8) {
                local_a0._0_8_ = pAVar8->symbol;
                local_a0._8_8_ = plVar6[3];
                local_b0 = (AssertionInstanceDetails *)local_a0;
              }
              else {
                local_a0._0_8_ = pAVar8->symbol;
              }
              local_a8 = plVar6[1];
              *plVar6 = (long)pAVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
              local_f0._0_8_ = *plVar6;
              pAVar9 = (ASTContext *)(plVar6 + 2);
              if ((ASTContext *)local_f0._0_8_ == pAVar9) {
                pSVar2 = (pAVar9->scope).ptr;
                lStack_d8 = plVar6[3];
                local_f0._16_2_ = SUB82(pSVar2,0);
                local_f0._18_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
                local_f0._0_8_ = (ASTContext *)(local_f0 + 0x10);
              }
              else {
                pSVar2 = (pAVar9->scope).ptr;
                local_f0._16_2_ = SUB82(pSVar2,0);
                local_f0._18_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
              }
              lVar3 = plVar6[1];
              local_f0[8] = SUB81(lVar3,0);
              local_f0[9] = (undefined1)((ulong)lVar3 >> 8);
              local_f0._10_6_ = (undefined6)((ulong)lVar3 >> 0x10);
              *plVar6 = (long)pAVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::logic_error::logic_error(this_02,(string *)local_f0);
              __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            local_f4 = Reject;
          }
          local_f5 = false;
        }
        else {
          if (TVar1 == SyncAcceptOnKeyword) {
            local_f4 = Accept;
          }
          else {
            if (TVar1 != SyncRejectOnKeyword) goto LAB_00385a93;
            local_f4 = Reject;
          }
          local_f5 = true;
        }
        local_f0[8] = false;
        local_f0._10_2_ = Statements;
        local_f0._12_2_ = 0x2e;
        local_f0._14_2_ = Statements;
        local_f0._16_2_ = 0x2f;
        local_f0._0_8_ = context;
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
                  (this_01,this_01,(SampledValueExprVisitor *)local_f0);
        pAVar5 = BumpAllocator::
                 emplace<slang::ast::AbortAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&,slang::ast::AbortAssertionExpr::Action&,bool&>
                           (&this->super_BumpAllocator,this_01,
                            (AssertionExpr *)CONCAT44(extraout_var,iVar4),&local_f4,&local_f5);
        return &pAVar5->super_AssertionExpr;
      }
      func = 
      "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
      ;
    }
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

bool visitInvalid(const AssertionExpr&) { return false; }